

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O3

aiReturn aiGetMaterialColor(aiMaterial *pMat,char *pKey,uint type,uint index,aiColor4D *pOut)

{
  aiReturn aVar1;
  uint iMax;
  uint local_14;
  
  local_14 = 4;
  aVar1 = aiGetMaterialFloatArray(pMat,pKey,type,index,&pOut->r,&local_14);
  if (local_14 == 3) {
    pOut->a = 1.0;
  }
  return aVar1;
}

Assistant:

aiReturn aiGetMaterialColor(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiColor4D* pOut)
{
    unsigned int iMax = 4;
    const aiReturn eRet = aiGetMaterialFloatArray(pMat,pKey,type,index,(ai_real*)pOut,&iMax);

    // if no alpha channel is defined: set it to 1.0
    if (3 == iMax) {
        pOut->a = 1.0;
    }

    return eRet;
}